

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bit_vector.h
# Opt level: O1

bool Catch::Internal::
     Evaluator<bsim::dynamic_bit_vector,_bsim::dynamic_bit_vector,_(Catch::Internal::Operator)0>::
     evaluate(dynamic_bit_vector *lhs,dynamic_bit_vector *rhs)

{
  uint uVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = lhs->N;
  if (rhs->N == uVar1) {
    if ((int)uVar1 < 1) {
      return (int)uVar1 < 1;
    }
    pbVar2 = (lhs->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pbVar3 = (rhs->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (((*pbVar3 ^ *pbVar2) & 1) == 0) {
      uVar4 = 1;
      do {
        uVar5 = uVar4;
        uVar6 = uVar1;
        if (uVar1 == uVar5) break;
        uVar4 = uVar5 + 1;
        uVar6 = uVar5;
      } while (((pbVar3[uVar5 >> 3] ^ pbVar2[uVar5 >> 3]) >> (uVar5 & 7) & 1) == 0);
      return (int)uVar1 <= (int)uVar6;
    }
  }
  return false;
}

Assistant:

inline int bitLength() const {
      return N;
    }